

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O2

void llbuild::basic::spawnProcess
               (ProcessDelegate *delegate,ProcessContext *ctx,ProcessGroup *pgrp,
               ProcessHandle handle,ArrayRef<llvm::StringRef> commandLine,
               POSIXEnvironment environment,ProcessAttributes attr,ProcessReleaseFn *releaseFn,
               ProcessCompletionFn *completionFn)

{
  __node_base_ptr p_Var1;
  __node_base_ptr p_Var2;
  undefined1 auVar3 [16];
  StringRef value;
  StringRef value_00;
  pointer this;
  __buckets_ptr pp_Var4;
  ProcessHandle PVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  element_type *peVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  bool bVar10;
  long lVar11;
  storage_type *psVar12;
  ManagedDescriptor *pMVar13;
  uint *puVar14;
  ulong uVar15;
  char **__envp;
  int *piVar16;
  size_t sVar17;
  char *pcVar18;
  long lVar19;
  FileDescriptor __fd;
  undefined8 **ppuVar20;
  sys *this_00;
  lock_guard<std::mutex> *lock;
  ProcessContext *pPVar21;
  string *__return_storage_ptr__;
  StringRef *pSVar22;
  int i_2;
  _Any_data *completionFn_00;
  int i_1;
  int iVar23;
  function<bool_(llvm::StringRef)> *this_01;
  byte bVar24;
  bool bVar25;
  StringRef Name;
  error_code eVar26;
  StringRef key;
  StringRef key_00;
  StringRef __args;
  llbuild_pid_t pid;
  ProcessHandle handle_local;
  pollfd readfds [2];
  lock_guard<std::mutex> guard;
  ManagedDescriptor outputPipeParentEnd;
  ManagedDescriptor controlPipeParentEnd;
  ManagedDescriptor controlPipeChildEnd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsStorage;
  ManagedDescriptor outputPipeChildEnd;
  undefined8 *local_14d8;
  undefined8 uStack_14d0;
  code *local_14c8 [2];
  shared_ptr<ManagedDescriptor> controlFdShared;
  shared_ptr<ManagedDescriptor> outputFdShared;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  string whatPipe;
  __shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2> local_1448;
  __shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2> local_1438;
  __node_base_ptr local_1428;
  __node_base_ptr p_Stack_1420;
  __node_base_ptr local_1418;
  __node_base_ptr p_Stack_1410;
  Twine local_1408;
  undefined4 uStack_13ec;
  undefined4 local_13e8;
  undefined4 uStack_13e4;
  undefined4 uStack_13e0;
  undefined4 uStack_13dc;
  undefined8 local_13d8;
  string workingDir;
  posix_spawn_file_actions_t fileActions;
  string local_1360;
  Twine taskID;
  ControlProtocolState control;
  Twine local_12d0;
  Twine local_12b8;
  Twine local_12a0;
  posix_spawnattr_t attributes;
  sigset_t mostSignals;
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> res;
  sigset_t noSignals;
  string *__buf;
  
  this = environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  completionFn_00 = (_Any_data *)environment.keys._M_h._M_buckets;
  pid = -1;
  if (environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish._1_1_ == 1) {
    environment.envStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_1_ = '\0';
  }
  handle_local = handle;
  if (commandLine.Length != 0) {
    pSVar22 = commandLine.Data + commandLine.Length;
    argsStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    argsStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    argsStorage.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<llvm::StringRef_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&argsStorage,
               commandLine.Data,pSVar22);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (&args,((long)argsStorage.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)argsStorage.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) + 1,
               (allocator_type *)&res);
    lVar11 = 0;
    for (lVar19 = 0;
        lVar19 != (long)argsStorage.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)argsStorage.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5; lVar19 = lVar19 + 1) {
      *(undefined8 *)
       ((long)args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11) =
           *(undefined8 *)
            ((long)&((argsStorage.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11 * 4);
      lVar11 = lVar11 + 8;
    }
    *(undefined8 *)
     ((long)args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start + lVar11) = 0;
    posix_spawnattr_init((posix_spawnattr_t *)&attributes);
    sigemptyset((sigset_t *)&noSignals);
    posix_spawnattr_setsigmask((posix_spawnattr_t *)&attributes,(sigset_t *)&noSignals);
    sigemptyset((sigset_t *)&mostSignals);
    iVar23 = 1;
    do {
      if ((iVar23 != 9) && (iVar23 != 0x13)) {
        if (iVar23 == 0x1f) goto LAB_00135d12;
        sigaddset((sigset_t *)&mostSignals,iVar23);
      }
      iVar23 = iVar23 + 1;
    } while( true );
  }
  attributes.__flags = 1;
  attributes._2_2_ = 0;
  attributes.__pgrp = -1;
  attributes.__sd.__val[0]._0_4_ = 0xffffffff;
  attributes.__sd.__val[1] = 0;
  attributes.__sd.__val[2] = 0;
  attributes.__sd.__val[3] = 0;
  (*delegate->_vptr_ProcessDelegate[2])(delegate,ctx,handle.id,0xffffffffffffffff);
  llvm::Twine::Twine((Twine *)&res,"no arguments for command");
  (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,handle.id,(Twine *)&res);
  (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,handle_local.id,&attributes);
  res._32_8_ = attributes.__sd.__val[3];
  res.field_0._16_4_ = (undefined4)attributes.__sd.__val[1];
  res.field_0._20_4_ = attributes.__sd.__val[1]._4_4_;
  res.field_0._24_4_ = (undefined4)attributes.__sd.__val[2];
  res.field_0._28_4_ = attributes.__sd.__val[2]._4_4_;
  res.field_0._0_4_ = attributes._0_4_;
  res.field_0._4_4_ = attributes.__pgrp;
  res.field_0._8_4_ = (undefined4)attributes.__sd.__val[0];
  res.field_0._12_4_ = attributes.__sd.__val[0]._4_4_;
  if (*(__buckets_ptr)((long)completionFn_00 + 0x10) != (__node_base_ptr)0x0) {
    (*(code *)*(__buckets_ptr)((long)completionFn_00 + 0x18))(completionFn_00,&res);
    return;
  }
  goto LAB_00136cb7;
LAB_00135d12:
  posix_spawnattr_setsigdefault((posix_spawnattr_t *)&attributes,(sigset_t *)&mostSignals);
  bVar25 = false;
  posix_spawnattr_setpgroup((posix_spawnattr_t *)&attributes,0);
  posix_spawnattr_setflags
            ((posix_spawnattr_t *)&attributes,
             (environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_finish._1_1_ ^ 1) * 2 + 0xc);
  posix_spawn_file_actions_init((posix_spawn_file_actions_t *)&fileActions);
  llvm::StringRef::str_abi_cxx11_
            (&workingDir,
             (StringRef *)
             &environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (workingDir._M_string_length != 0) {
    iVar23 = posix_spawn_file_actions_addchdir_np(&fileActions,workingDir._M_dataplus._M_p);
    bVar25 = iVar23 != 0x26;
  }
  outputPipeParentEnd._descriptor = -1;
  outputPipeParentEnd._closedProperly = true;
  outputPipeParentEnd._file =
       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
  ;
  controlPipeParentEnd._descriptor = -1;
  outputPipeParentEnd._line = 799;
  controlPipeParentEnd._closedProperly = true;
  controlPipeParentEnd._file =
       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
  ;
  controlPipeParentEnd._line = 800;
  llvm::Twine::utohexstr(&taskID,&handle_local.id);
  llvm::Twine::str_abi_cxx11_((string *)&res,&taskID);
  value.Data._4_4_ = res.field_0._4_4_;
  value.Data._0_4_ = res.field_0._0_4_;
  value.Length._0_4_ = res.field_0._8_4_;
  value.Length._4_4_ = res.field_0._12_4_;
  key.Length = 0xf;
  key.Data = "LLBUILD_TASK_ID";
  POSIXEnvironment::setIfMissing((POSIXEnvironment *)this,key,value);
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&res,
                     argsStorage.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  iVar23 = 2;
  bVar10 = llvm::sys::path::is_absolute((Twine *)&res,native);
  if (!bVar10) {
    this_00 = (sys *)((argsStorage.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    Name.Length = 0;
    Name.Data = (char *)(argsStorage.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pSVar22;
    llvm::sys::findProgramByName_abi_cxx11_
              (&res,this_00,Name,(ArrayRef<llvm::StringRef>)(auVar3 << 0x40));
    iVar23 = (int)this_00;
    eVar26 = llvm::
             ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::getError(&res);
    if (eVar26._M_value == 0) {
      psVar12 = llvm::
                ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::getStorage(&res);
      iVar23 = (int)psVar12;
      std::__cxx11::string::_M_assign
                ((string *)
                 argsStorage.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      *args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_start =
           ((argsStorage.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    }
    llvm::ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~ErrorOr(&res);
  }
  guard._M_device = &pgrp->mutex;
  std::mutex::lock(guard._M_device);
  bVar10 = pgrp->closed;
  if (bVar10 == true) {
    pthread_mutex_unlock((pthread_mutex_t *)guard._M_device);
  }
  else {
    outputPipeChildEnd._descriptor = -1;
    outputPipeChildEnd._closedProperly = true;
    outputPipeChildEnd._file =
         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
    ;
    outputPipeChildEnd._line = 0x34a;
    controlPipeChildEnd._descriptor = -1;
    controlPipeChildEnd._closedProperly = true;
    controlPipeChildEnd._file =
         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
    ;
    controlPipeChildEnd._line = 0x34b;
    if (environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish._1_1_ == 1) {
      posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)&fileActions,0,0);
      posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)&fileActions,1,1);
      __fd = 2;
      posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)&fileActions,2,2);
LAB_001360c0:
      if (environment.envStorage.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_1_ == '\x01') {
        res.field_0._0_4_ = 0xffffffff;
        res.field_0._4_4_ = 0xffffffff;
        iVar23 = sys::pipe((int *)&res);
        if (iVar23 < 0) {
          ManagedDescriptor::close(&outputPipeParentEnd,__fd);
          ManagedDescriptor::close(&outputPipeChildEnd,__fd);
          puVar14 = (uint *)__errno_location();
          uVar15 = (ulong)*puVar14 << 0x20 | 2;
          goto LAB_00136160;
        }
        pMVar13 = ManagedDescriptor::reset(&controlPipeParentEnd,(FileDescriptor *)&res);
        ManagedDescriptor::childMayInherit(pMVar13,false);
        ManagedDescriptor::reset(&controlPipeChildEnd,(FileDescriptor *)((long)&res.field_0 + 4));
        posix_spawn_file_actions_adddup2
                  ((posix_spawn_file_actions_t *)&fileActions,controlPipeChildEnd._descriptor,
                   controlPipeChildEnd._descriptor);
      }
    }
    else {
      posix_spawn_file_actions_addopen((posix_spawn_file_actions_t *)&fileActions,0,"/dev/null",0,0)
      ;
      res.field_0._0_4_ = 0xffffffff;
      res.field_0._4_4_ = 0xffffffff;
      iVar23 = sys::pipe((int *)&res);
      if (-1 < iVar23) {
        pMVar13 = ManagedDescriptor::reset(&outputPipeParentEnd,(FileDescriptor *)&res);
        ManagedDescriptor::childMayInherit(pMVar13,false);
        ManagedDescriptor::reset(&outputPipeChildEnd,(FileDescriptor *)((long)&res.field_0 + 4));
        posix_spawn_file_actions_adddup2
                  ((posix_spawn_file_actions_t *)&fileActions,outputPipeChildEnd._descriptor,1);
        posix_spawn_file_actions_adddup2
                  ((posix_spawn_file_actions_t *)&fileActions,outputPipeChildEnd._descriptor,2);
        __fd = outputPipeChildEnd._descriptor;
        posix_spawn_file_actions_addclose
                  ((posix_spawn_file_actions_t *)&fileActions,outputPipeChildEnd._descriptor);
        goto LAB_001360c0;
      }
      puVar14 = (uint *)__errno_location();
      uVar15 = ((ulong)*puVar14 << 0x20) + 1;
LAB_00136160:
      if ((int)uVar15 != 0) {
        pcVar18 = "control pipe";
        if ((int)uVar15 == 1) {
          pcVar18 = "output pipe";
        }
        std::__cxx11::string::string((string *)&whatPipe,pcVar18,(allocator *)&res);
        posix_spawn_file_actions_destroy((posix_spawn_file_actions_t *)&fileActions);
        posix_spawnattr_destroy((posix_spawnattr_t *)&attributes);
        (*delegate->_vptr_ProcessDelegate[2])(delegate,ctx,handle_local.id,(ulong)(uint)pid);
        PVar5 = handle_local;
        std::operator+(&control.controlID,"unable to open ",&whatPipe);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                       &control.controlID," (");
        llvm::Twine::Twine((Twine *)&controlFdShared,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res
                          );
        pcVar18 = strerror((int)(uVar15 >> 0x20));
        llvm::Twine::Twine(&local_1408,pcVar18);
        llvm::Twine::concat((Twine *)&outputFdShared,(Twine *)&controlFdShared,&local_1408);
        llvm::Twine::Twine((Twine *)readfds,")");
        llvm::Twine::concat((Twine *)&local_1360,(Twine *)&outputFdShared,(Twine *)readfds);
        pp_Var4 = environment.keys._M_h._M_buckets;
        (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,PVar5.id,&local_1360);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        res.field_0._0_4_ = 1;
        res.field_0._4_4_ = 0xffffffff;
        res.field_0._8_4_ = 0xffffffff;
        res.field_0._16_4_ = 0;
        res.field_0._20_4_ = 0;
        res.field_0._24_4_ = 0;
        res.field_0._28_4_ = 0;
        res._32_8_ = 0;
        (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,handle_local.id,&res);
        res.field_0._0_4_ = 1;
        res.field_0._4_4_ = 0xffffffff;
        res.field_0._8_4_ = 0xffffffff;
        res._32_8_ = 0;
        res.field_0._16_4_ = 0;
        res.field_0._20_4_ = 0;
        res.field_0._24_4_ = 0;
        res.field_0._28_4_ = 0;
        if (pp_Var4[2] != (__node_base_ptr)0x0) {
          (*(code *)pp_Var4[3])(pp_Var4,&res);
          std::__cxx11::string::_M_dispose();
          ManagedDescriptor::~ManagedDescriptor(&controlPipeChildEnd);
          ManagedDescriptor::~ManagedDescriptor(&outputPipeChildEnd);
          pthread_mutex_unlock((pthread_mutex_t *)guard._M_device);
          goto LAB_00136a25;
        }
        goto LAB_00136cb7;
      }
    }
    if (-1 < (long)controlPipeChildEnd._descriptor) {
      whatPipe._M_dataplus._M_p = (pointer)&control;
      whatPipe.field_2._M_allocated_capacity._0_2_ = 0x10e;
      control.controlID._M_dataplus._M_p = (pointer)(long)controlPipeChildEnd._descriptor;
      llvm::Twine::str_abi_cxx11_((string *)&res,(Twine *)&whatPipe);
      value_00.Data._4_4_ = res.field_0._4_4_;
      value_00.Data._0_4_ = res.field_0._0_4_;
      value_00.Length._0_4_ = res.field_0._8_4_;
      value_00.Length._4_4_ = res.field_0._12_4_;
      key_00.Length = 0x12;
      key_00.Data = "LLBUILD_CONTROL_FD";
      POSIXEnvironment::setIfMissing((POSIXEnvironment *)this,key_00,value_00);
      std::__cxx11::string::_M_dispose();
    }
    bVar25 = (bool)(bVar25 | workingDir._M_string_length == 0);
    if (bVar25) {
      pcVar18 = *args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      __envp = POSIXEnvironment::getEnvp((POSIXEnvironment *)this);
      iVar23 = posix_spawn(&pid,pcVar18,(posix_spawn_file_actions_t *)&fileActions,
                           (posix_spawnattr_t *)&attributes,
                           args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                           _M_impl.super__Vector_impl_data._M_start,__envp);
    }
    else {
      iVar23 = -1;
    }
    (*delegate->_vptr_ProcessDelegate[2])(delegate,ctx,handle_local.id,(ulong)(uint)pid);
    PVar5 = handle_local;
    if (iVar23 == 0) {
      lock = &guard;
      ProcessGroup::add(pgrp,lock,pid,
                        environment.env.
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish._0_1_);
      iVar23 = (int)lock;
    }
    else {
      res.field_0._0_4_ = 1;
      res.field_0._4_4_ = 0xffffffff;
      res.field_0._8_4_ = 0xffffffff;
      res._32_8_ = 0;
      res.field_0._16_4_ = 0;
      res.field_0._20_4_ = 0;
      res.field_0._24_4_ = 0;
      res.field_0._28_4_ = 0;
      if (bVar25) {
        llvm::Twine::Twine(&local_1408,"unable to spawn process \'");
        llvm::Twine::Twine((Twine *)readfds,
                           argsStorage.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        llvm::Twine::concat((Twine *)&controlFdShared,&local_1408,(Twine *)readfds);
        llvm::Twine::Twine(&local_12a0,"\' (");
        llvm::Twine::concat((Twine *)&outputFdShared,(Twine *)&controlFdShared,&local_12a0);
        sys::strerror_abi_cxx11_((sys *)&local_1360,iVar23);
        llvm::Twine::Twine(&local_12b8,&local_1360);
        completionFn_00 = (_Any_data *)environment.keys._M_h._M_buckets;
        llvm::Twine::concat((Twine *)&control,(Twine *)&outputFdShared,&local_12b8);
        llvm::Twine::Twine(&local_12d0,")");
        llvm::Twine::concat((Twine *)&whatPipe,(Twine *)&control,&local_12d0);
      }
      else {
        llvm::Twine::Twine((Twine *)&whatPipe,"working-directory unsupported on this platform");
      }
      (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,PVar5.id,&whatPipe);
      if (bVar25) {
        std::__cxx11::string::_M_dispose();
      }
      pPVar21 = ctx;
      (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,handle_local.id,&res);
      iVar23 = (int)pPVar21;
      pid = -1;
    }
    ManagedDescriptor::close(&controlPipeChildEnd,iVar23);
    ManagedDescriptor::close(&outputPipeChildEnd,iVar23);
    ManagedDescriptor::~ManagedDescriptor(&controlPipeChildEnd);
    ManagedDescriptor::~ManagedDescriptor(&outputPipeChildEnd);
    pthread_mutex_unlock((pthread_mutex_t *)guard._M_device);
  }
  posix_spawn_file_actions_destroy((posix_spawn_file_actions_t *)&fileActions);
  posix_spawnattr_destroy((posix_spawnattr_t *)&attributes);
  if (pid == -1) {
    ManagedDescriptor::close(&outputPipeParentEnd,iVar23);
    ManagedDescriptor::close(&controlPipeParentEnd,iVar23);
    local_13d8 = 0;
    res.field_0._0_4_ = bVar10 + 1;
    res.field_0._4_4_ = 0xffffffff;
    res.field_0._8_4_ = 0xffffffff;
    local_13e8 = 0;
    uStack_13e4 = 0;
    uStack_13e0 = 0;
    uStack_13dc = 0;
    res.field_0._28_4_ = 0;
    res._32_8_ = 0;
    res.field_0._12_4_ = uStack_13ec;
    res.field_0._16_4_ = 0;
    res.field_0._20_4_ = 0;
    res.field_0._24_4_ = 0;
    if (*(long *)(completionFn_00 + 1) == 0) {
LAB_00136cb7:
      std::__throw_bad_function_call();
    }
    (**(code **)((long)completionFn_00 + 0x18))(completionFn_00,(ProcessResult *)&res);
  }
  else {
    readfds[0].fd = outputPipeParentEnd._descriptor;
    readfds[0].events = 0;
    readfds[0].revents = 0;
    readfds[1].fd = controlPipeParentEnd._descriptor;
    readfds[1].events = 0;
    readfds[1].revents = 0;
    __return_storage_ptr__ = (string *)&res;
    llvm::Twine::str_abi_cxx11_(__return_storage_ptr__,&taskID);
    ControlProtocolState::ControlProtocolState(&control,__return_storage_ptr__);
    std::__cxx11::string::_M_dispose();
    PVar5 = handle_local;
    outputPipeChildEnd._descriptor = 0;
    outputPipeChildEnd._closedProperly = false;
    outputPipeChildEnd._5_3_ = 0;
    outputPipeChildEnd._file = (char *)0x0;
    outputPipeChildEnd._0_8_ = operator_new(0x18);
    *(ProcessDelegate **)outputPipeChildEnd._0_8_ = delegate;
    *(ProcessContext **)(outputPipeChildEnd._0_8_ + 8) = ctx;
    *(uint64_t *)(outputPipeChildEnd._0_8_ + 0x10) = PVar5.id;
    outputPipeChildEnd._16_8_ =
         std::
         _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:976:5)>
         ::_M_manager;
    local_14d8 = (undefined8 *)0x0;
    uStack_14d0 = 0;
    local_14d8 = (undefined8 *)operator_new(0x20);
    *local_14d8 = delegate;
    local_14d8[1] = &control;
    local_14d8[2] = ctx;
    local_14d8[3] = PVar5.id;
    local_14c8[1] =
         std::
         _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:982:5)>
         ::_M_invoke;
    local_14c8[0] =
         std::
         _Function_handler<bool_(llvm::StringRef),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:982:5)>
         ::_M_manager;
    if (environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish._1_1_ == 0) {
      readfds[0].events = 1;
    }
    if (environment.envStorage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_1_ == '\x01') {
      readfds[1].events = 1;
      bVar24 = 1;
    }
    else {
      bVar24 = environment.env.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish._1_1_ ^ 1;
    }
    do {
      if ((bVar24 & 1) == 0) {
        ManagedDescriptor::close(&outputPipeParentEnd,(int)__return_storage_ptr__);
        cleanUpExecutedProcess
                  (delegate,pgrp,pid,handle_local,ctx,(ProcessCompletionFn *)completionFn_00,
                   &controlPipeParentEnd);
        goto LAB_001369ec;
      }
      if (readfds[0].fd != outputPipeParentEnd._descriptor) {
        __assert_fail("readfds[0].fd == outputPipeParentEnd.unsafeDescriptor()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                      ,0x42f,
                      "void llbuild::basic::spawnProcess(ProcessDelegate &, ProcessContext *, ProcessGroup &, ProcessHandle, ArrayRef<StringRef>, POSIXEnvironment, ProcessAttributes, ProcessReleaseFn &&, ProcessCompletionFn &&)"
                     );
      }
      if (readfds[1].fd != controlPipeParentEnd._descriptor) {
        __assert_fail("readfds[1].fd == controlPipeParentEnd.unsafeDescriptor()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp"
                      ,0x430,
                      "void llbuild::basic::spawnProcess(ProcessDelegate &, ProcessContext *, ProcessGroup &, ProcessHandle, ArrayRef<StringRef>, POSIXEnvironment, ProcessAttributes, ProcessReleaseFn &&, ProcessCompletionFn &&)"
                     );
      }
      while (__return_storage_ptr__ = (string *)0x2, iVar23 = poll((pollfd *)readfds,2,-1),
            iVar23 == -1) {
        piVar16 = __errno_location();
        PVar5 = handle_local;
        iVar23 = *piVar16;
        if ((iVar23 != 4) && (iVar23 != 0xb)) {
          llvm::Twine::Twine((Twine *)&outputFdShared,"failed to poll (");
          pcVar18 = strerror(iVar23);
          llvm::Twine::Twine((Twine *)&controlFdShared,pcVar18);
          llvm::Twine::concat((Twine *)&controlPipeChildEnd,(Twine *)&outputFdShared,
                              (Twine *)&controlFdShared);
          llvm::Twine::Twine(&local_1408,")");
          llvm::Twine::concat((Twine *)&whatPipe,(Twine *)&controlPipeChildEnd,&local_1408);
          (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,PVar5.id,&whatPipe);
          goto LAB_001369ec;
        }
      }
      this_01 = (function<bool_(llvm::StringRef)> *)&outputPipeChildEnd;
      bVar24 = 0;
      for (lVar11 = 0; __buf = (string *)&res, lVar11 != 2; lVar11 = lVar11 + 1) {
        if ((readfds[lVar11].revents & 0x19) == 0) {
LAB_00136871:
          bVar24 = bVar24 | readfds[lVar11].events != 0;
        }
        else {
          __return_storage_ptr__ = __buf;
          sVar17 = read(readfds[lVar11].fd,__buf,0x1000);
          if ((long)sVar17 < 0) {
            piVar16 = __errno_location();
            PVar5 = handle_local;
            iVar23 = *piVar16;
            llvm::Twine::Twine((Twine *)&outputFdShared,"unable to read process output (");
            pcVar18 = strerror(iVar23);
            llvm::Twine::Twine((Twine *)&controlFdShared,pcVar18);
            llvm::Twine::concat((Twine *)&controlPipeChildEnd,(Twine *)&outputFdShared,
                                (Twine *)&controlFdShared);
            llvm::Twine::Twine(&local_1408,")");
            llvm::Twine::concat((Twine *)&whatPipe,(Twine *)&controlPipeChildEnd,&local_1408);
            __return_storage_ptr__ = (string *)ctx;
            (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,PVar5.id,&whatPipe);
          }
          else if ((sVar17 != 0) &&
                  (__args.Length = sVar17, __args.Data = (char *)__buf,
                  bVar25 = std::function<bool_(llvm::StringRef)>::operator()(this_01,__args),
                  __return_storage_ptr__ = __buf, bVar25)) goto LAB_00136871;
          readfds[lVar11].events = 0;
        }
        this_01 = this_01 + 1;
      }
      completionFn_00 = (_Any_data *)environment.keys._M_h._M_buckets;
    } while (control.releaseSeen == false);
    std::make_shared<ManagedDescriptor,ManagedDescriptor>((ManagedDescriptor *)&outputFdShared);
    std::make_shared<ManagedDescriptor,ManagedDescriptor>((ManagedDescriptor *)&controlFdShared);
    whatPipe.field_2._M_allocated_capacity._0_2_ = (undefined2)pid;
    whatPipe.field_2._M_allocated_capacity._2_2_ = (undefined2)((uint)pid >> 0x10);
    whatPipe.field_2._8_8_ = handle_local.id;
    whatPipe._M_dataplus._M_p = (pointer)delegate;
    whatPipe._M_string_length = (size_type)pgrp;
    std::__shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1448,
               (__shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2> *)&outputFdShared);
    std::__shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1438,
               (__shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2> *)&controlFdShared);
    local_1428 = (__node_base_ptr)0x0;
    p_Stack_1420 = (__node_base_ptr)0x0;
    local_1418 = (__node_base_ptr)0x0;
    p_Var1 = environment.keys._M_h._M_buckets[3];
    p_Var2 = environment.keys._M_h._M_buckets[2];
    if (p_Var2 != (__node_base_ptr)0x0) {
      local_1428 = *environment.keys._M_h._M_buckets;
      p_Stack_1420 = environment.keys._M_h._M_buckets[1];
      environment.keys._M_h._M_buckets[2] = (__node_base_ptr)0x0;
      environment.keys._M_h._M_buckets[3] = (__node_base_ptr)0x0;
      local_1418 = p_Var2;
    }
    controlPipeChildEnd._file = (char *)0x0;
    p_Stack_1410 = p_Var1;
    controlPipeChildEnd._0_8_ = operator_new(0x68);
    _Var9._M_pi = local_1438._M_refcount._M_pi;
    peVar8 = local_1438._M_ptr;
    _Var7._M_pi = local_1448._M_refcount._M_pi;
    peVar6 = local_1448._M_ptr;
    *(pointer *)controlPipeChildEnd._0_8_ = whatPipe._M_dataplus._M_p;
    *(size_type *)(controlPipeChildEnd._0_8_ + 8) = whatPipe._M_string_length;
    *(ulong *)(controlPipeChildEnd._0_8_ + 0x10) =
         CONCAT44(whatPipe.field_2._M_allocated_capacity._4_4_,
                  CONCAT22(whatPipe.field_2._M_allocated_capacity._2_2_,
                           whatPipe.field_2._M_allocated_capacity._0_2_));
    *(undefined8 *)(controlPipeChildEnd._0_8_ + 0x18) = whatPipe.field_2._8_8_;
    local_1448._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(ProcessContext **)(controlPipeChildEnd._0_8_ + 0x20) = ctx;
    local_1448._M_ptr = (element_type *)0x0;
    local_1438._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)(controlPipeChildEnd._0_8_ + 0x28) = peVar6;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(controlPipeChildEnd._0_8_ + 0x30) =
         _Var7._M_pi;
    local_1438._M_ptr = (element_type *)0x0;
    *(element_type **)(controlPipeChildEnd._0_8_ + 0x38) = peVar8;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(controlPipeChildEnd._0_8_ + 0x40) =
         _Var9._M_pi;
    *(undefined8 *)(controlPipeChildEnd._0_8_ + 0x58) = 0;
    *(undefined8 *)(controlPipeChildEnd._0_8_ + 0x48) = 0;
    *(undefined8 *)(controlPipeChildEnd._0_8_ + 0x50) = 0;
    *(__node_base_ptr *)(controlPipeChildEnd._0_8_ + 0x60) = p_Var1;
    if (p_Var2 != (__node_base_ptr)0x0) {
      *(__node_base_ptr *)(controlPipeChildEnd._0_8_ + 0x48) = local_1428;
      *(__node_base_ptr *)(controlPipeChildEnd._0_8_ + 0x50) = p_Stack_1420;
      *(__node_base_ptr *)(controlPipeChildEnd._0_8_ + 0x58) = p_Var2;
      local_1418 = (__node_base_ptr)0x0;
      p_Stack_1410 = (__node_base_ptr)0x0;
    }
    controlPipeChildEnd._16_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/Subprocess.cpp:1107:17)>
         ::_M_manager;
    std::function<void_(std::function<void_()>_&&)>::operator()
              ((function<void_(std::function<void_()>_&&)> *)
               environment.envStorage.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (function<void_()> *)&controlPipeChildEnd);
    if (controlPipeChildEnd._16_8_ != 0) {
      (*(code *)controlPipeChildEnd._16_8_)(&controlPipeChildEnd,&controlPipeChildEnd,3);
    }
    spawnProcess(llbuild::basic::ProcessDelegate&,llbuild::basic::ProcessContext*,llbuild::basic::ProcessGroup&,llbuild::basic::ProcessHandle,llvm::ArrayRef<llvm::StringRef>,llbuild::basic::POSIXEnvironment,llbuild::basic::ProcessAttributes,std::function<void(std::function<void()>&&)>&&,std::function<void(llbuild::basic::ProcessResult)>&&)
    ::$_2::~__2((__2 *)&whatPipe);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&controlFdShared.super___shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&outputFdShared.super___shared_ptr<ManagedDescriptor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
LAB_001369ec:
    lVar11 = -0x40;
    ppuVar20 = &local_14d8;
    do {
      if ((code *)ppuVar20[2] != (code *)0x0) {
        (*(code *)ppuVar20[2])(ppuVar20,ppuVar20,3);
      }
      ppuVar20 = ppuVar20 + -4;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    ControlProtocolState::~ControlProtocolState(&control);
  }
LAB_00136a25:
  ManagedDescriptor::~ManagedDescriptor(&controlPipeParentEnd);
  ManagedDescriptor::~ManagedDescriptor(&outputPipeParentEnd);
  std::__cxx11::string::_M_dispose();
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argsStorage);
  return;
}

Assistant:

void llbuild::basic::spawnProcess(
    ProcessDelegate& delegate,
    ProcessContext* ctx,
    ProcessGroup& pgrp,
    ProcessHandle handle,
    ArrayRef<StringRef> commandLine,
    POSIXEnvironment environment,
    ProcessAttributes attr,
    ProcessReleaseFn&& releaseFn,
    ProcessCompletionFn&& completionFn
) {
  llbuild_pid_t pid = (llbuild_pid_t)-1;
  
#if !defined(_WIN32) && !defined(HAVE_POSIX_SPAWN)
  auto result = ProcessResult::makeFailed();
  delegate.processStarted(ctx, handle, pid);
  delegate.processHadError(ctx, handle, Twine("process spawning is unavailable"));
  delegate.processFinished(ctx, handle, result);
  completionFn(result);
  return;
#else
  // Don't use lane release feature for console workloads.
  if (attr.connectToConsole) {
    attr.controlEnabled = false;
  }

#if defined(_WIN32)
  // Control channel support is broken (thread-unsafe) on Windows.
  attr.controlEnabled = false;
#endif

  if (commandLine.size() == 0) {
    auto result = ProcessResult::makeFailed();
    delegate.processStarted(ctx, handle, pid);
    delegate.processHadError(ctx, handle, Twine("no arguments for command"));
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }

  // Form the complete C string command line.
  std::vector<std::string> argsStorage(commandLine.begin(), commandLine.end());
#if defined(_WIN32)
  std::string args = llbuild::basic::formatWindowsCommandString(argsStorage);

  // Convert the command line string to utf16
  llvm::SmallVector<llvm::UTF16, 20> u16Executable;
  llvm::SmallVector<llvm::UTF16, 20> u16CmdLine;
  llvm::convertUTF8ToUTF16String(argsStorage[0], u16Executable);
  llvm::convertUTF8ToUTF16String(args, u16CmdLine);
#else
  std::vector<const char*> args(argsStorage.size() + 1);
  for (size_t i = 0; i != argsStorage.size(); ++i) {
    args[i] = argsStorage[i].c_str();
  }
  args[argsStorage.size()] = nullptr;
#endif

#if defined(_WIN32)
  DWORD creationFlags = NORMAL_PRIORITY_CLASS |
                        CREATE_UNICODE_ENVIRONMENT;
  PROCESS_INFORMATION processInfo = {0};

#else
  // Initialize the spawn attributes.
  posix_spawnattr_t attributes;
  posix_spawnattr_init(&attributes);

  // Unmask all signals.
  sigset_t noSignals;
  sigemptyset(&noSignals);
  posix_spawnattr_setsigmask(&attributes, &noSignals);

  // Reset all signals to default behavior.
  //
  // On Linux, this can only be used to reset signals that are legal to
  // modify, so we have to take care about the set we use.
#if defined(__linux__)
  sigset_t mostSignals;
  sigemptyset(&mostSignals);
  for (int i = 1; i < SIGSYS; ++i) {
    if (i == SIGKILL || i == SIGSTOP) continue;
    sigaddset(&mostSignals, i);
  }
  posix_spawnattr_setsigdefault(&attributes, &mostSignals);
#else
  sigset_t mostSignals;
  sigfillset(&mostSignals);
  sigdelset(&mostSignals, SIGKILL);
  sigdelset(&mostSignals, SIGSTOP);
  posix_spawnattr_setsigdefault(&attributes, &mostSignals);
#endif // else !defined(_WIN32)

  // Establish a separate process group.
  posix_spawnattr_setpgroup(&attributes, 0);

  // Set the attribute flags.
  unsigned flags = POSIX_SPAWN_SETSIGMASK | POSIX_SPAWN_SETSIGDEF;
  if (!attr.connectToConsole) {
    flags |= POSIX_SPAWN_SETPGROUP;
  }

  // Close all other files by default.
  //
  // FIXME: Note that this is an Apple-specific extension, and we will have to
  // do something else on other platforms (and unfortunately, there isn't
  // really an easy answer other than using a stub executable).
#ifdef __APPLE__
  flags |= POSIX_SPAWN_CLOEXEC_DEFAULT;
#endif

  // On Darwin, set the QoS of launched processes to one of the current thread.
#ifdef __APPLE__
  posix_spawnattr_set_qos_class_np(&attributes, qos_class_self());
#endif

  posix_spawnattr_setflags(&attributes, flags);

  // Setup the file actions.
  posix_spawn_file_actions_t fileActions;
  posix_spawn_file_actions_init(&fileActions);

  bool usePosixSpawnChdirFallback = true;
  const auto workingDir = attr.workingDir.str();
  if (!workingDir.empty() &&
      posix_spawn_file_actions_addchdir(&fileActions, workingDir.c_str()) != ENOSYS) {
    usePosixSpawnChdirFallback = false;
  }

#endif

#if defined(_WIN32)
  /// Process startup information for Windows.
  STARTUPINFOW startupInfo = {0};
  PlatformSpecificPipesConfig& pipesConfig = startupInfo;
#else
  PlatformSpecificPipesConfig& pipesConfig = fileActions;
#endif

  // Automatically managed (released) descriptors for output and control pipes.
  // The child ends are forwarded to the child (and quickly released in the
  // parent). The parent ends are retained and read/written by the parent.
  ManagedDescriptor outputPipeParentEnd{__FILE__, __LINE__};
  ManagedDescriptor controlPipeParentEnd{__FILE__, __LINE__};

#if defined(_WIN32)
  llvm::SmallVector<llvm::UTF16, 20> u16Cwd;
  std::string workingDir = attr.workingDir.str();
  if (!workingDir.empty()) {
    llvm::convertUTF8ToUTF16String(workingDir, u16Cwd);
  }
#endif

  // Export a task ID to subprocesses.
  auto taskID = Twine::utohexstr(handle.id);
  environment.setIfMissing("LLBUILD_TASK_ID", taskID.str());

  // Resolve the executable path, if necessary.
  //
  // FIXME: This should be cached.
  if (!llvm::sys::path::is_absolute(argsStorage[0])) {
    auto res = llvm::sys::findProgramByName(argsStorage[0]);
    if (!res.getError()) {
      argsStorage[0] = *res;
#if defined(_WIN32)
      u16Executable.clear();
      llvm::convertUTF8ToUTF16String(argsStorage[0], u16Executable);
#else
      args[0] = argsStorage[0].c_str();
#endif
    }
  }

  // Spawn the command.
  bool wasCancelled;
  do {
      // We need to hold the spawn processes lock when we spawn, to ensure that
      // we don't create a process in between when we are cancelled.
      std::lock_guard<std::mutex> guard(pgrp.mutex);
      wasCancelled = pgrp.isClosed();

      // If we have been cancelled since we started, skip startup.
      if (wasCancelled) { break; }

      // The partf of the control pipes that are inherited by the child.
      ManagedDescriptor outputPipeChildEnd{__FILE__, __LINE__};
      ManagedDescriptor controlPipeChildEnd{__FILE__, __LINE__};

      // Open the communication channel under the mutex to avoid
      // leaking the wrong channel into other children started concurrently.
      auto errorPair = createCommunicationPipes(attr, pipesConfig, outputPipeParentEnd, outputPipeChildEnd, controlPipeParentEnd, controlPipeChildEnd);
      if (errorPair.first != CommunicationPipesCreationError::ERROR_NONE) {
        std::string whatPipe = errorPair.first == CommunicationPipesCreationError::OUTPUT_PIPE_FAILED ? "output pipe" : "control pipe";
#if !defined(_WIN32)
        posix_spawn_file_actions_destroy(&fileActions);
        posix_spawnattr_destroy(&attributes);
#endif
        delegate.processStarted(ctx, handle, pid);
        delegate.processHadError(ctx, handle,
            Twine("unable to open " + whatPipe + " (") + strerror(errorPair.second) + ")");
        delegate.processFinished(ctx, handle, ProcessResult::makeFailed());
        completionFn(ProcessResult(ProcessStatus::Failed));
        return;
      }

      if (controlPipeChildEnd.isValid()) {
        long long controlFd = (long long)controlPipeChildEnd.unsafeDescriptor();
        environment.setIfMissing("LLBUILD_CONTROL_FD", Twine(controlFd).str());
      }

      int result = 0;

      bool workingDirectoryUnsupported = false;

#if !defined(_WIN32)
      if (usePosixSpawnChdirFallback) {
#if defined(__APPLE__)
        thread_local std::string threadWorkingDir;

        if (workingDir.empty()) {
          if (!threadWorkingDir.empty()) {
            pthread_fchdir_np(-1);
            threadWorkingDir.clear();
          }
        } else {
          if (threadWorkingDir != workingDir) {
            if (pthread_chdir_np(workingDir.c_str()) == -1) {
              result = errno;
            } else {
              threadWorkingDir = workingDir;
            }
          }
        }
#else
        if (!workingDir.empty()) {
          workingDirectoryUnsupported = true;
          result = -1;
        }
#endif // if defined(__APPLE__)
      }
#endif // else !defined(_WIN32)

      if (result == 0) {
#if defined(_WIN32)
        auto unicodeEnv = environment.getWindowsEnvp();
        result = !CreateProcessW(
            /*lpApplicationName=*/(LPWSTR)u16Executable.data(),
            (LPWSTR)u16CmdLine.data(),
            /*lpProcessAttributes=*/NULL,
            /*lpThreadAttributes=*/NULL,
            /*bInheritHandles=*/TRUE, creationFlags,
            /*lpEnvironment=*/unicodeEnv.get(),
            /*lpCurrentDirectory=*/u16Cwd.empty() ? NULL
                                                  : (LPWSTR)u16Cwd.data(),
            &startupInfo, &processInfo);
#else
        result =
            posix_spawn(&pid, args[0], /*file_actions=*/&fileActions,
                        /*attrp=*/&attributes, const_cast<char**>(args.data()),
                        const_cast<char* const*>(environment.getEnvp()));
#endif
      }
    
      delegate.processStarted(ctx, handle, pid);

      if (result != 0) {
        auto processResult = ProcessResult::makeFailed();
#if defined(_WIN32)
        result = GetLastError();
#endif
        delegate.processHadError(
            ctx, handle,
            workingDirectoryUnsupported
                ? Twine("working-directory unsupported on this platform")
                : Twine("unable to spawn process '") + argsStorage[0] + "' (" + sys::strerror(result) +
                      ")");
        delegate.processFinished(ctx, handle, processResult);
        pid = (llbuild_pid_t)-1;
      } else {
#if defined(_WIN32)
        pid = processInfo.hProcess;
#endif
        ProcessInfo info{ attr.canSafelyInterrupt };
        pgrp.add(std::move(guard), pid, info);
      }

    // Close the child ends of the forwarded output and control pipes.
    controlPipeChildEnd.close();
    outputPipeChildEnd.close();
  } while(false);

#if !defined(_WIN32)
  posix_spawn_file_actions_destroy(&fileActions);
  posix_spawnattr_destroy(&attributes);
#endif

  // If we failed to launch a process, clean up and abort.
  if (pid == (llbuild_pid_t)-1) {
    // Manually close to avoid triggering debug-time leak check.
    outputPipeParentEnd.close();
    controlPipeParentEnd.close();
    auto result = wasCancelled ? ProcessResult::makeCancelled() : ProcessResult::makeFailed();
    completionFn(result);
    return;
  }

#if !defined(_WIN32)
  // Set up our poll() structures. We use assert() to ensure
  // the file descriptors are alive.
  pollfd readfds[] = {
    { outputPipeParentEnd.unsafeDescriptor(), 0, 0 },
    { controlPipeParentEnd.unsafeDescriptor(), 0, 0 }
  };
  bool activeEvents = false;
#endif
  const int nfds = 2;
  ControlProtocolState control(taskID.str());
  std::function<bool (StringRef)> readCbs[] = {
    // output capture callback
    [&delegate, ctx, handle](StringRef buf) -> bool {
      // Notify the client of the output.
      delegate.processHadOutput(ctx, handle, buf);
      return true;
    },
    // control callback handle
    [&delegate, &control, ctx, handle](StringRef buf) mutable -> bool {
      std::string errstr;
      int ret = control.read(buf, &errstr);
      if (ret < 0) {
        delegate.processHadError(ctx, handle,
                                 Twine("control protocol error" + errstr));
      }
      return (ret == 0);
    }
  };
#if defined(_WIN32)
  struct threadData {
    std::function<void(void*)> reader;
    const ManagedDescriptor& handle;
    std::function<bool(StringRef)> cb;
  };
  HANDLE readers[2] = {NULL, NULL};
  auto reader = [&delegate, handle, ctx](void* lpArgs) {
    threadData* args = (threadData*)lpArgs;
    for (;;) {
      char buf[4096];
      DWORD numBytes;
      bool result = ReadFile(args->handle.unsafeDescriptor(), buf, sizeof(buf), &numBytes, NULL);

      if (!result || numBytes == 0) {
        if (GetLastError() == ERROR_BROKEN_PIPE) {
          // Pipe done, exit
          return;
        } else {
          delegate.processHadError(ctx, handle,
                                   Twine("unable to read process output (") +
                                       sys::strerror(GetLastError()) + ")");
        }
      }

      if (numBytes <= 0 || !args->cb(StringRef(buf, numBytes))) {
        continue;
      }
    }
  };

  struct threadData outputThreadParams = {reader, outputPipeParentEnd, readCbs[0]};
  struct threadData controlThreadParams = {reader, controlPipeParentEnd, readCbs[1]};
  HANDLE threads[2] = {NULL, NULL};
#endif // defined(_WIN32)

  int threadCount = 0;

  // Read the command output, if capturing instead of pass-throughing.
  if (!attr.connectToConsole) {
#if defined(_WIN32)
    threads[threadCount++] = (HANDLE)_beginthread(
        [](LPVOID lpParams) { ((threadData*)lpParams)->reader(lpParams); }, 0,
        &outputThreadParams);
#else
    readfds[0].events = POLLIN;
    activeEvents = true;
    (void)threadCount;
#endif
  }

  // Process the control channel input.
  if (attr.controlEnabled) {
#if defined(_WIN32)
    threads[threadCount++] = (HANDLE)_beginthread(
        [](LPVOID lpParams) { ((threadData*)lpParams)->reader(lpParams); }, 0,
        &controlThreadParams);
#else
    readfds[1].events = POLLIN;
    activeEvents = true;
#endif
  }

#if defined(_WIN32)
  DWORD waitResult = WaitForMultipleObjects(threadCount, threads,
                                            /*bWaitAll=*/false,
                                            /*dwMilliseconds=*/INFINITE);
  if (WAIT_FAILED == waitResult || WAIT_TIMEOUT == waitResult) {
    int err = GetLastError();
    delegate.processHadError(
        ctx, handle, Twine("failed to poll (") + sys::strerror(err) + ")");
  }
#else  // !defined(_WIN32)
  while (activeEvents) {
    char buf[4096];
    activeEvents = false;

    // Ensure we haven't autoclosed the file descriptors,
    // or move()d somewhere they could be autoclosed in.
    assert(readfds[0].fd == outputPipeParentEnd.unsafeDescriptor());
    assert(readfds[1].fd == controlPipeParentEnd.unsafeDescriptor());

    while (poll(readfds, nfds, -1) == -1) {
        int err = errno;

        if (err == EAGAIN || err == EINTR) {
          continue;
        } else {
          delegate.processHadError(ctx, handle,
            Twine("failed to poll (") + strerror(err) + ")"); 
          return;
        }
    }

    for (int i = 0; i < nfds; i++) {
      if (readfds[i].revents & (POLLIN | POLLERR | POLLHUP)) {
        ssize_t numBytes = read(readfds[i].fd, buf, sizeof(buf));
        if (numBytes < 0) {
          int err = errno;
          delegate.processHadError(ctx, handle,
              Twine("unable to read process output (") + strerror(err) + ")");
        }
        if (numBytes <= 0 || !readCbs[i](StringRef(buf, numBytes))) {
          readfds[i].events = 0;
          continue;
        }
      }
      activeEvents |= readfds[i].events != 0;
    }

    if (control.shouldRelease()) {
      std::shared_ptr<ManagedDescriptor> outputFdShared
        = std::make_shared<ManagedDescriptor>(std::move(outputPipeParentEnd));
      std::shared_ptr<ManagedDescriptor> controlFdShared
        = std::make_shared<ManagedDescriptor>(std::move(controlPipeParentEnd));
      releaseFn([&delegate, &pgrp, pid, handle, ctx,
                 outputFdShared, controlFdShared,
                 completionFn=std::move(completionFn)]() mutable {
        if (outputFdShared->isValid()) {
          captureExecutedProcessOutput(delegate, *outputFdShared, handle, ctx);
        }
        cleanUpExecutedProcess(delegate, pgrp, pid, handle, ctx,
                               std::move(completionFn), *controlFdShared);
      });
      return;
    }

  }
#endif // else !defined(_WIN32)
  // If we have reached here, both the control and read pipes have given us
  // the requisite EOF/hang-up events. Safe to close the read end of the
  // output pipe.
  outputPipeParentEnd.close();
  cleanUpExecutedProcess(delegate, pgrp, pid, handle, ctx,
                         std::move(completionFn), controlPipeParentEnd);
#endif
}